

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O3

boolean artifact_hit(monst *magr,monst *mdef,obj *otmp,obj *ostack,boolean thrown,int *dmgptr,
                    int dieroll)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  boolean bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  obj **ppoVar11;
  char *pcVar12;
  obj *poVar13;
  size_t sVar14;
  char *pcVar15;
  int *piVar16;
  bool bVar17;
  monst *mtmp;
  undefined8 uVar18;
  char *pcVar19;
  byte bVar20;
  bool youattack;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  char hittee_1 [256];
  char hittee [256];
  char wepbuf [256];
  obj *local_490;
  char *local_470;
  char local_438 [4];
  undefined2 auStack_434 [2];
  undefined1 auStack_430 [248];
  char local_338 [256];
  char local_238 [256];
  char local_138 [264];
  
  youattack = magr == &youmonst;
  if ((youattack == (magr != (monst *)0x0)) ||
     (bVar17 = true, (viz_array[magr->my][magr->mx] & 2U) == 0)) {
    if (mdef != &youmonst) {
      bVar17 = (bool)((viz_array[mdef->my][mdef->mx] & 2U) >> 1);
      if ((magr == &youmonst) && ((viz_array[mdef->my][mdef->mx] & 2U) == 0)) goto LAB_0014d198;
      goto LAB_0014d1f8;
    }
    if (magr == &youmonst) {
LAB_0014d198:
      bVar17 = false;
      if (((u._1052_1_ & 1) == 0) || (u.ustuck != mdef)) goto LAB_0014d1f8;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
          bVar17 = true;
          if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0014d1f8;
          goto LAB_0014d1c6;
        }
      }
      else {
LAB_0014d1c6:
        if (ublindf == (obj *)0x0) {
          bVar17 = false;
          goto LAB_0014d1f8;
        }
      }
      bVar17 = ublindf->oartifact == '\x1d';
      goto LAB_0014d1f8;
    }
    bVar17 = false;
    if (thrown != '\0') goto LAB_0014d206;
    bVar17 = false;
LAB_0014d288:
    local_490 = (obj *)0x0;
  }
  else {
LAB_0014d1f8:
    if (thrown == '\0') goto LAB_0014d288;
    if (magr == &youmonst) {
      ppoVar11 = &uwep;
    }
    else {
LAB_0014d206:
      if (magr == (monst *)0x0) goto LAB_0014d288;
      ppoVar11 = &magr->mw;
    }
    local_490 = *ppoVar11;
    if ((((((local_490 == (obj *)0x0) || (local_490->oclass != '\x02')) ||
          (2 < (byte)(objects[local_490->otyp].oc_subtyp - 0x16U))) ||
         ((otmp->oclass != '\r' && (otmp->oclass != '\x02')))) ||
        (2 < (byte)(objects[otmp->otyp].oc_subtyp + 0x18U))) ||
       ((int)objects[otmp->otyp].oc_subtyp != -(uint)(byte)objects[local_490->otyp].oc_subtyp))
    goto LAB_0014d288;
  }
  if ((otmp->oartifact == '\0') && (bVar5 = oprop_attack(0xf,otmp,local_490,thrown), bVar5 == '\0'))
  {
    return '\0';
  }
  pcVar19 = "The";
  if (magr == &youmonst) {
    pcVar19 = "Your";
  }
  pcVar12 = distant_name(otmp,xname);
  local_470 = local_238;
  snprintf(local_470,0x100,"%s %s",pcVar19,pcVar12);
  if (mdef == &youmonst) {
    pcVar12 = "you";
  }
  else {
    pcVar12 = mon_nam(mdef);
  }
  strcpy(local_338,pcVar12);
  iVar6 = spec_dbon(otmp,local_490,thrown,mdef,*dmgptr);
  *dmgptr = *dmgptr + iVar6;
  if (magr == &youmonst && mdef == &youmonst) {
    warning("attacking yourself with weapon?");
    return '\0';
  }
  bVar21 = mdef == &youmonst;
  bVar22 = bVar17 != false;
  bVar3 = u.ustuck == mdef;
  bVar4 = magr == &youmonst;
  bVar5 = attacks(2,otmp,local_490,thrown);
  if (bVar5 == '\0') {
    bVar23 = false;
  }
  else {
    local_470 = local_238;
    if (((bVar22 || bVar21) || bVar3 && bVar4) &&
       (otmp->oartifact != '\0' || spec_applies_ad_fire != '\0')) {
      if (otmp->oartifact == '\f') {
        local_470 = "The fiery blade";
      }
      if (spec_applies_ad_fire == '\0') {
        pcVar12 = "hits";
        uVar18 = 0x2e;
      }
      else {
        pcVar12 = "burns";
        if (mdef->data == mons + 0xa2) {
          pcVar12 = "vaporizes part of";
        }
        uVar18 = 0x21;
      }
      pline("%s %s %s%c",local_470,pcVar12,local_338,uVar18);
      bVar23 = true;
      if (spec_applies_ad_fire != '\0') {
        oprop_id(1,otmp,ostack,local_490);
      }
    }
    else {
      bVar23 = false;
    }
    uVar7 = mt_random();
    if (((uVar7 & 3) == 0) &&
       (bVar5 = destroy_mitem(mdef,8,2,dmgptr),
       bVar5 != '\0' && ((bVar22 || bVar21) || bVar3 && bVar4))) {
      oprop_id(1,otmp,ostack,local_490);
    }
    uVar7 = mt_random();
    if (((uVar7 & 3) == 0) &&
       (bVar5 = destroy_mitem(mdef,9,2,dmgptr),
       bVar5 != '\0' && ((bVar22 || bVar21) || bVar3 && bVar4))) {
      oprop_id(1,otmp,ostack,local_490);
    }
    uVar7 = mt_random();
    if ((uVar7 * -0x49249249 < 0x24924925) &&
       (bVar5 = destroy_mitem(mdef,10,2,dmgptr),
       bVar5 != '\0' && ((bVar22 || bVar21) || bVar3 && bVar4))) {
      oprop_id(1,otmp,ostack,local_490);
    }
    if ((mdef == &youmonst) && (u.uprops[0x3a].intrinsic != 0)) {
      burn_away_slime();
      oprop_id(1,otmp,ostack,local_490);
    }
  }
  bVar5 = attacks(3,otmp,local_490,thrown);
  if (bVar5 == '\0') {
LAB_0014d676:
    bVar5 = attacks(6,otmp,local_490,thrown);
    if (bVar5 != '\0') {
      if ((bVar22 || bVar21) || bVar3 && bVar4) goto LAB_0014d693;
LAB_0014d6da:
      uVar7 = mt_random();
      if (uVar7 * -0x33333333 < 0x33333334) {
        destroy_mitem(mdef,0xb,6,dmgptr);
      }
    }
  }
  else {
    if (((bVar22 || bVar21) || bVar3 && bVar4) &&
       (otmp->oartifact != '\0' || spec_applies_ad_cold != '\0')) {
      if (otmp->oartifact == '\v') {
        local_470 = "The ice-cold blade";
      }
      pcVar12 = "freezes";
      if (spec_applies_ad_cold == '\0') {
        pcVar12 = "hits";
      }
      uVar18 = 0x21;
      if (spec_applies_ad_cold == '\0') {
        uVar18 = 0x2e;
      }
      pline("%s %s %s%c",local_470,pcVar12,local_338,uVar18);
      bVar23 = true;
      if (spec_applies_ad_cold != '\0') {
        oprop_id(2,otmp,ostack,local_490);
      }
    }
    uVar7 = mt_random();
    if (((uVar7 & 3) != 0) ||
       (bVar5 = destroy_mitem(mdef,8,3,dmgptr),
       bVar5 == '\0' || (!bVar22 && !bVar21) && (!bVar3 || !bVar4))) goto LAB_0014d676;
    oprop_id(2,otmp,ostack,local_490);
    bVar5 = attacks(6,otmp,local_490,thrown);
    if (bVar5 != '\0') {
LAB_0014d693:
      if (otmp->oartifact != '\0' || spec_applies_ad_elec != '\0') {
        pcVar12 = "!  Lightning strikes";
        if (spec_applies_ad_elec == '\0') {
          pcVar12 = "";
        }
        uVar18 = 0x21;
        if (spec_applies_ad_elec == '\0') {
          uVar18 = 0x2e;
        }
        pline("The massive hammer hits%s %s%c",pcVar12,local_338,uVar18);
        bVar23 = true;
      }
      goto LAB_0014d6da;
    }
  }
  bVar5 = attacks(1,otmp,local_490,thrown);
  if ((bVar5 != '\0' && ((bVar22 || bVar21) || bVar3 && bVar4)) &&
     (otmp->oartifact != '\0' || spec_applies_ad_magm != '\0')) {
    pcVar12 = "!  A hail of magic missiles strikes";
    if (spec_applies_ad_magm == '\0') {
      pcVar12 = "";
    }
    uVar18 = 0x21;
    if (spec_applies_ad_magm == '\0') {
      uVar18 = 0x2e;
    }
    pline("The imaginary widget hits%s %s%c",pcVar12,local_338,uVar18);
    bVar23 = true;
  }
  bVar5 = attacks(0xc,otmp,local_490,thrown);
  if ((dieroll < 9) && (bVar5 != '\0')) {
    bVar20 = otmp->spe;
    uVar7 = 4;
    if ('\x02' < (char)bVar20) {
      uVar7 = 4 >> (bVar20 / 3 & 0x1f);
    }
    bVar23 = spec_applies_ad_stun == '\0';
    iVar6 = (uint)bVar23 + dieroll;
    if ((char)bVar20 < '\x01') {
      bVar20 = 0;
    }
    uVar8 = mt_random();
    uVar8 = uVar8 % ((uint)!bVar23 * 4 + 7);
    uVar9 = mt_random();
    *dmgptr = (uVar9 & 3) + *dmgptr + 1;
    uVar9 = (uint)bVar20;
    if (uVar9 <= uVar8 && uVar8 != bVar20) {
      uVar10 = mt_random();
      *dmgptr = (uVar10 & 3) + *dmgptr + 1;
    }
    uVar10 = (uint)(uVar9 <= uVar8 && uVar8 != bVar20);
    if (iVar6 <= (int)uVar7) {
      uVar10 = mt_random();
      *dmgptr = (uVar10 & 3) + *dmgptr + 1;
      uVar10 = 2;
    }
    if (iVar6 <= (int)(uVar7 >> 1)) {
      uVar7 = mt_random();
      *dmgptr = (uVar7 & 3) + *dmgptr + 1;
      uVar10 = 3;
    }
    uVar7 = 0;
    if (((u.uprops[0x23].intrinsic != 0) && (uVar7 = 0, u.uprops[0x24].extrinsic == 0)) &&
       (uVar7 = 1, u.umonnum != u.umonster)) {
      bVar5 = dmgtype(youmonst.data,0x24);
      uVar7 = (uint)(bVar5 == '\0');
    }
    if (((magr == &youmonst || mdef == &youmonst) | bVar17) != 1) {
LAB_0014d996:
      bVar5 = (*(code *)(&DAT_0029d960 + *(int *)(&DAT_0029d960 + (ulong)uVar10 * 4)))();
      return bVar5;
    }
    pcVar12 = vtense((char *)0x0,
                     *(char **)((long)mb_verb[0] + (ulong)uVar10 * 8 + (ulong)(uVar7 << 5)));
    pline("The magic-absorbing blade %s %s!",pcVar12,local_338);
    if (uVar10 != 0) goto LAB_0014d996;
    if (mdef->wormno == '\0') {
      if ((viz_array[mdef->my][mdef->mx] & 2U) != 0) goto LAB_0014dcf1;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014db7d;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014db74;
      }
      else {
LAB_0014db74:
        if (ublindf == (obj *)0x0) goto LAB_0014dd46;
LAB_0014db7d:
        if (ublindf->oartifact != '\x1d') goto LAB_0014dd46;
      }
      if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
          (((youmonst.data)->mflags3 & 0x100) != 0)) &&
         (((viz_array[mdef->my][mdef->mx] & 1U) != 0 && ((mdef->data->mflags3 & 0x200) != 0))))
      goto LAB_0014dcf1;
LAB_0014dd46:
      if (((mdef->data->mflags1 & 0x10000) == 0) &&
         ((poVar13 = which_armor(mdef,4), poVar13 == (obj *)0x0 ||
          (poVar13 = which_armor(mdef,4), poVar13->otyp != 0x4f)))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014dd97;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014dd92;
        }
        else {
LAB_0014dd92:
          if (ublindf != (obj *)0x0) {
LAB_0014dd97:
            if (ublindf->oartifact == '\x1d') goto LAB_0014de34;
          }
          if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
               youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_0014dea9;
        }
LAB_0014de34:
        if ((u.uprops[0x19].extrinsic != 0) &&
           ((u.uprops[0x19].blocked == 0 &&
            (iVar6 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy), iVar6 < 0x41))))
        goto LAB_0014dea9;
      }
      if ((u.uprops[0x42].intrinsic == 0) &&
         ((u.uprops[0x42].extrinsic == 0 && (bVar5 = match_warn_of_mon(mdef), bVar5 == '\0')))) {
        map_invisible(mdef->mx,mdef->my);
      }
    }
    else {
      bVar5 = worm_known(level,mdef);
      if (bVar5 == '\0') goto LAB_0014dd46;
LAB_0014dcf1:
      uVar7 = *(uint *)&mdef->field_0x60;
      if ((((uVar7 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0))
      {
        if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_0014dd32;
        goto LAB_0014dd46;
      }
      if ((uVar7 & 0x280) != 0) goto LAB_0014dd46;
LAB_0014dd32:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_0014dd46;
    }
LAB_0014dea9:
    if ((magr == &youmonst) &&
       ((bVar20 = otmp->spe, bVar20 == 0 ||
        (bVar20 = (bVar20 ^ (char)bVar20 >> 7) - ((char)bVar20 >> 7), uVar7 = mt_random(),
        uVar7 % ((uint)bVar20 + (uint)bVar20 * 2) == 0)))) {
      bVar20 = 0;
      pline("The %s is insightful.");
      probe_monster(mdef);
      bVar17 = true;
      if (uVar9 < uVar8) {
LAB_0014debf:
        if (mdef == &youmonst) {
          make_stunned((ulong)(u.uprops[0x1b].intrinsic + 3),'\0');
        }
        else {
          mdef->field_0x62 = mdef->field_0x62 | 0x10;
        }
        bVar17 = false;
        bVar20 = 1;
      }
    }
    else {
      if (uVar9 < uVar8) goto LAB_0014debf;
      bVar17 = true;
      bVar20 = 0;
    }
    uVar7 = mt_random();
    uVar7 = uVar7 % 0xc;
    if (uVar7 == 0) {
      if (mdef == &youmonst) {
        make_confused((ulong)(u.uprops[0x1c].intrinsic + 4),'\0');
      }
      else {
        mdef->field_0x62 = mdef->field_0x62 | 0x20;
      }
    }
    upstart(local_338);
    if ((!(bool)(~bVar20 & uVar7 != 0)) && (flags.verbose != '\0')) {
      local_438[0] = '\0';
      if (!bVar17) {
        sVar14 = strlen(local_438);
        builtin_strncpy(local_438 + sVar14,"stunned",8);
      }
      bVar17 = (bool)(bVar20 & uVar7 == 0);
      if (bVar17) {
        sVar14 = strlen(local_438);
        builtin_strncpy(local_438 + sVar14," and",4);
        *(undefined2 *)((long)auStack_434 + sVar14) = 0x20;
LAB_0014e0ab:
        sVar14 = strlen(local_438);
        builtin_strncpy(local_438 + sVar14,"confused",8);
        auStack_430[sVar14] = 0;
      }
      else if (uVar7 == 0) goto LAB_0014e0ab;
      pcVar12 = vtense(local_338,"are");
      uVar18 = 0x2e;
      if (bVar17) {
        uVar18 = 0x21;
      }
      pline("%s %s %s%c",local_338,pcVar12,local_438,uVar18);
    }
    bVar23 = true;
  }
  bVar20 = otmp->oartifact;
  if ((long)(char)bVar20 == 4 && mdef == &youmonst) {
    if (spec_applies_ad_drli == '\0') {
      bVar20 = 4;
    }
    else {
LAB_0014e198:
      if ((artilist[(char)bVar20].spfx & 0x100) == 0) goto LAB_0014e1b0;
LAB_0014e1ce:
      iVar6 = u.uhpmax;
      if ((magr == &youmonst || magr == (monst *)0x0) ||
         (bVar17 = true, (viz_array[magr->my][magr->mx] & 2U) == 0)) {
        if (mdef == &youmonst) {
          if (magr == &youmonst) {
LAB_0014e262:
            bVar17 = false;
            if (((u._1052_1_ & 1) == 0) || (u.ustuck != mdef)) goto LAB_0014e2bf;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
                bVar17 = true;
                if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0014e2bf;
                goto LAB_0014e28b;
              }
            }
            else {
LAB_0014e28b:
              if (ublindf == (obj *)0x0) {
                bVar17 = false;
                goto LAB_0014e2bf;
              }
            }
            bVar17 = ublindf->oartifact == '\x1d';
            goto LAB_0014e2bf;
          }
          goto LAB_0014e30b;
        }
        bVar17 = (bool)((viz_array[mdef->my][mdef->mx] & 2U) >> 1);
        if ((magr == &youmonst) && ((viz_array[mdef->my][mdef->mx] & 2U) == 0)) goto LAB_0014e262;
LAB_0014e2c8:
        if (bVar17 != false) {
          if (bVar20 == 3) {
            pcVar12 = hcolor("black");
            pcVar15 = mon_nam(mdef);
            pline("The %s blade draws the life from %s!",pcVar12,pcVar15);
          }
          else {
            pcVar12 = distant_name(otmp,xname);
            pcVar12 = The(pcVar12);
            pcVar15 = mon_nam(mdef);
            pline("%s draws the life from %s!",pcVar12,pcVar15);
            oprop_id(4,otmp,ostack,local_490);
          }
        }
        if (mdef->m_lev == '\0') {
          *dmgptr = mdef->mhp * 2 + 200;
        }
        else {
          uVar8 = mt_random();
          uVar7 = (uVar8 & 7) + 1;
          *dmgptr = *dmgptr + uVar7;
          mdef->mhpmax = mdef->mhpmax - uVar7;
          mdef->m_lev = mdef->m_lev + 0xff;
          if ((uVar8 & 7) != 0) {
            healup(uVar7 >> 1,0,'\0','\0');
          }
        }
      }
      else {
LAB_0014e2bf:
        if (mdef != &youmonst) goto LAB_0014e2c8;
LAB_0014e30b:
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014e333;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014e32e;
LAB_0014e424:
          if (bVar20 == 3) {
            pcVar12 = hcolor("black");
            pcVar15 = "The %s blade drains your life!";
            goto LAB_0014e440;
          }
          pcVar12 = distant_name(otmp,xname);
          pcVar12 = The(pcVar12);
          pline("%s drains your life!",pcVar12);
          oprop_id(4,otmp,ostack,local_490);
        }
        else {
LAB_0014e32e:
          if (ublindf != (obj *)0x0) {
LAB_0014e333:
            if (ublindf->oartifact == '\x1d') goto LAB_0014e424;
          }
          pcVar12 = "object";
          if (bVar20 == 3) {
            pcVar12 = "unholy blade";
          }
          pcVar15 = "You feel an %s drain your life!";
LAB_0014e440:
          pline(pcVar15,pcVar12);
        }
        losexp("life drainage");
        bVar17 = true;
        if (magr != (monst *)0x0) {
          iVar2 = magr->mhpmax;
          if (magr->mhp < iVar2) {
            iVar6 = (iVar6 - u.uhpmax) / 2 + magr->mhp;
            if (iVar2 <= iVar6) {
              iVar6 = iVar2;
            }
            magr->mhp = iVar6;
          }
        }
      }
      bVar23 = bVar17 != false || bVar23 != false;
      bVar20 = otmp->oartifact;
    }
  }
  else {
    if (spec_applies_spfx_behead == '\0' && (spec_applies_ad_drli == '\0' && spec_dbon_applies == 0)
       ) {
      return bVar23;
    }
    if (spec_applies_ad_drli != '\0') {
      if (bVar20 != 0) goto LAB_0014e198;
LAB_0014e1b0:
      bVar5 = oprop_attack(4,otmp,local_490,thrown);
      if (bVar5 != '\0') goto LAB_0014e1ce;
    }
  }
  if ((spec_applies_spfx_behead != '\0') &&
     (((bVar20 != 0 && ((artilist[(char)bVar20].spfx & 0x400) != 0)) ||
      (bVar5 = oprop_attack(8,otmp,local_490,thrown), bVar5 != '\0')))) {
    if (((magr != (monst *)0x0) != youattack) &&
       (bVar17 = true, (viz_array[magr->my][magr->mx] & 2U) != 0)) goto LAB_0014e5e2;
    if (mdef == &youmonst) {
      if (magr == &youmonst) goto LAB_0014e5a4;
LAB_0014e5e0:
      bVar17 = false;
    }
    else {
      bVar17 = (bool)((viz_array[mdef->my][mdef->mx] & 2U) >> 1);
      if ((magr == &youmonst) && ((viz_array[mdef->my][mdef->mx] & 2U) == 0)) {
LAB_0014e5a4:
        bVar17 = false;
        if (((u._1052_1_ & 1) != 0) && (bVar17 = false, u.ustuck == mdef)) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
              bVar17 = true;
              if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0014e5e2;
              goto LAB_0014e5d1;
            }
          }
          else {
LAB_0014e5d1:
            if (ublindf == (obj *)0x0) goto LAB_0014e5e0;
          }
          bVar17 = ublindf->oartifact == '\x1d';
        }
      }
    }
LAB_0014e5e2:
    pcVar15 = distant_name(otmp,xname);
    pcVar12 = local_138;
    snprintf(pcVar12,0x100,"%s %s",pcVar19,pcVar15);
    if (mdef == &youmonst) {
      pcVar19 = "you";
    }
    else {
      pcVar19 = mon_nam(mdef);
    }
    strcpy(local_438,pcVar19);
    if ((byte)(otmp->oclass | 4U) == 6) {
      if (((*(ushort *)&objects[otmp->otyp].field_0x11 & 1) == 0) ||
         (cVar1 = otmp->oartifact, dieroll != 1 || cVar1 == '\x04')) {
        if ((*(ushort *)&objects[otmp->otyp].field_0x11 & 1) == 0) goto LAB_0014e74e;
        goto LAB_0014e762;
      }
      pcVar12 = local_138;
      if (cVar1 == '!') {
        pcVar12 = "The razor-sharp blade";
      }
      if (cVar1 == '\0') {
        oprop_id(8,otmp,ostack,local_490);
      }
      if (((magr == &youmonst) && ((u._1052_1_ & 1) != 0)) && (u.ustuck == mdef)) {
        pcVar19 = mon_nam(mdef);
        pline("You slice %s wide open!",pcVar19);
        *dmgptr = mdef->mhp * 2 + 200;
        goto LAB_0014ea97;
      }
      if (mdef == &youmonst) {
        if ((youmonst.data)->msize < 3) {
          piVar16 = &u.mh;
          if (u.umonnum == u.umonster) {
            piVar16 = &u.uhp;
          }
          *dmgptr = *piVar16 * 2 + 200;
          pline("%s cuts you in half!",pcVar12);
          goto LAB_0014ec3d;
        }
        if (magr != (monst *)0x0) {
          pcVar12 = Monnam(magr);
        }
        pcVar19 = "%s cuts deeply into you!";
LAB_0014ea22:
        pline(pcVar19,pcVar12);
LAB_0014ea29:
        *dmgptr = *dmgptr << 1;
        goto LAB_0014ea97;
      }
      if (notonhead == '\0') {
        if (2 < mdef->data->msize) {
          if (magr == &youmonst) {
            pcVar12 = mon_nam(mdef);
            pcVar19 = "You slice deeply into %s!";
            goto LAB_0014ea22;
          }
          if (bVar17 != false) {
            pcVar19 = Monnam(magr);
            pline("%s cuts deeply into %s!",pcVar19,local_438);
          }
          goto LAB_0014ea29;
        }
        *dmgptr = mdef->mhp * 2 + 200;
        pcVar15 = mon_nam(mdef);
        pcVar19 = "%s cuts %s in half!";
        goto LAB_0014ec36;
      }
LAB_0014e953:
      bVar20 = 0;
    }
    else {
LAB_0014e74e:
      if ((dieroll == 1) || (mdef->data->mlet == '$')) {
LAB_0014e77d:
        if (((magr == &youmonst) && ((u._1052_1_ & 1) != 0)) && (u.ustuck == mdef))
        goto LAB_0014e953;
        bVar20 = otmp->oartifact;
        if (bVar20 == 0) {
          oprop_id(8,otmp,ostack,local_490);
        }
        else if ((bVar20 == 0x14) || (bVar20 == 4)) {
          pcVar12 = artilist[bVar20].name;
        }
        if (mdef == &youmonst) {
          if ((short)(youmonst.data)->mflags1 < 0) {
            if (bVar23 != false) goto LAB_0014e953;
            if (magr != (monst *)0x0) {
              pcVar12 = mon_nam(magr);
            }
            pline("Somehow, %s misses you wildly.",pcVar12);
            *dmgptr = 0;
          }
          else {
            if ((((youmonst.data)->mflags1 & 4) == 0) && ((youmonst.data)->mlet != '6')) {
              piVar16 = &u.mh;
              if (u.umonnum == u.umonster) {
                piVar16 = &u.uhp;
              }
              *dmgptr = *piVar16 * 2 + 200;
              uVar7 = mt_random();
              pcVar19 = *(char **)(artifact_hit_behead_behead_msg + (ulong)(uVar7 & 1) * 8);
              pcVar15 = "you";
              goto LAB_0014ec36;
            }
            pcVar19 = body_part(0xb);
            pline("%s slices through your %s.",pcVar12,pcVar19);
          }
        }
        else {
          uVar7 = mdef->data->mflags1;
          if ((((short)uVar7 < 0) || (notonhead != '\0')) || ((u._1052_1_ & 1) != 0)) {
            if (bVar23 == false) {
              bVar20 = magr == &youmonst | bVar17;
              if (magr == &youmonst || bVar17 != false) {
                pcVar19 = "Somehow, %s misses wildly.";
                mtmp = magr;
                if (magr == &youmonst) {
                  pcVar19 = "Somehow, you miss %s wildly.";
                  mtmp = mdef;
                }
                pcVar12 = mon_nam(mtmp);
                pline(pcVar19,pcVar12);
              }
              *dmgptr = 0;
              goto LAB_0014ea9a;
            }
            goto LAB_0014e953;
          }
          if (((uVar7 & 4) == 0) && (mdef->data->mlet != '6')) {
            *dmgptr = mdef->mhp * 2 + 200;
            uVar7 = mt_random();
            pcVar19 = *(char **)(artifact_hit_behead_behead_msg + (ulong)(uVar7 & 1) * 8);
            pcVar15 = mon_nam(mdef);
LAB_0014ec36:
            pline(pcVar19,pcVar12,pcVar15);
LAB_0014ec3d:
            if (otmp->oartifact == '\0') {
              return '\x01';
            }
            otmp->field_0x4a = otmp->field_0x4a | 0x20;
            return '\x01';
          }
          pcVar19 = mon_nam(mdef);
          pcVar19 = s_suffix(pcVar19);
          pcVar15 = mbodypart(mdef,0xb);
          pline("%s slices through %s %s.",pcVar12,pcVar19,pcVar15);
        }
LAB_0014ea97:
        bVar20 = 1;
      }
      else {
LAB_0014e762:
        bVar20 = 0;
        if ((dieroll < 3) && (otmp->oartifact == '\x04')) goto LAB_0014e77d;
      }
    }
LAB_0014ea9a:
    bVar23 = (bool)(bVar23 != false | bVar20);
    bVar20 = otmp->oartifact;
  }
  if (0x13 < bVar20) {
    return bVar23;
  }
  if ((0xce110U >> (bVar20 & 0x1f) & 1) == 0) {
    return bVar23;
  }
  if (3 < dieroll) {
    return bVar23;
  }
  if ((*(uint *)&mdef->field_0x60 & 0x100) != 0) {
    return bVar23;
  }
  if ((!bVar22 && !bVar21) && (!bVar3 || !bVar4)) goto LAB_0014eb93;
  pcVar19 = distant_name(otmp,xname);
  pcVar19 = The(pcVar19);
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014eb34;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014eb2f;
    pcVar12 = "shines brilliantly";
  }
  else {
LAB_0014eb2f:
    if (ublindf == (obj *)0x0) {
      pcVar12 = "roars deafeningly";
    }
    else {
LAB_0014eb34:
      pcVar12 = "roars deafeningly";
      if (ublindf->oartifact == '\x1d') {
        pcVar12 = "shines brilliantly";
      }
    }
  }
  pline("%s %s as it strikes %s!",pcVar19,pcVar12,local_338);
LAB_0014eb93:
  cancel_monst(mdef,otmp,youattack,'\x01',magr == mdef);
  return '\x01';
}

Assistant:

boolean artifact_hit(
    struct monst *magr,
    struct monst *mdef,
    struct obj *otmp,
    struct obj *ostack,
    boolean thrown,
    int *dmgptr,
    int dieroll /* needed for Magicbane and vorpal blades */
    )
{
	boolean youattack = (magr == &youmonst);
	boolean youdefend = (mdef == &youmonst);
	boolean vis = (!youattack && magr && cansee(magr->mx, magr->my))
	    || (!youdefend && cansee(mdef->mx, mdef->my))
	    || (youattack && u.uswallow && mdef == u.ustuck && !Blind);
	boolean realizes_damage;
	boolean msg_printed = FALSE;
	const char *wepdesc;
	char hittee[BUFSZ];
	char wepbuf[BUFSZ];
	struct obj *olaunch = NULL;

	if (thrown) {
	    /* Launcher properties stack with fired ammunition,
	     * so get the launcher here if that's the case. */
	    if (youattack)
		olaunch = uwep;
	    else if (magr)
		olaunch = MON_WEP(magr);

	    if (olaunch && (!is_launcher(olaunch) ||
			    !ammo_and_launcher(otmp, olaunch)))
		olaunch = NULL;
	}

	/* Exit early if not an artifact or absent of attack properties. */
	if (!otmp->oartifact &&
	    !oprop_attack(ITEM_FIRE|ITEM_FROST|ITEM_DRLI|ITEM_VORPAL,
			  otmp, olaunch, thrown))
	    return FALSE;

	snprintf(wepbuf, BUFSZ, "%s %s", youattack ? "Your" : "The",
					 distant_name(otmp, xname));
	wepdesc = wepbuf;

	strcpy(hittee, youdefend ? "you" : mon_nam(mdef));

	/* The following takes care of most of the damage, but not all--
	 * the exception being for level draining, which is specially
	 * handled.  Messages are done in this function, however.
	 */
	*dmgptr += spec_dbon(otmp, olaunch, thrown, mdef, *dmgptr);

	if (youattack && youdefend) {
	    warning("attacking yourself with weapon?");
	    return FALSE;
	}

	realizes_damage = (youdefend || vis || 
			   /* feel the effect even if not seen */
			   (youattack && mdef == u.ustuck));

	/* the four basic attacks: fire, cold, shock and missiles */
	if (attacks(AD_FIRE, otmp, olaunch, thrown)) {
	    if (realizes_damage && (otmp->oartifact || spec_applies_ad_fire)) {
		if (otmp->oartifact == ART_FIRE_BRAND)
		    wepdesc = "The fiery blade";
		pline("%s %s %s%c",
			wepdesc,
			!spec_applies_ad_fire ? "hits" :
			(mdef->data == &mons[PM_WATER_ELEMENTAL]) ?
			"vaporizes part of" : "burns",
			hittee, !spec_applies_ad_fire ? '.' : '!');
		msg_printed = TRUE;
		if (spec_applies_ad_fire)
		    oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
	    }
	    if (!rn2(4)) {
		if (destroy_mitem(mdef, POTION_CLASS, AD_FIRE, dmgptr)) {
		    if (realizes_damage)
			oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
		}
	    }
	    if (!rn2(4)) {
		if (destroy_mitem(mdef, SCROLL_CLASS, AD_FIRE, dmgptr)) {
		    if (realizes_damage)
			oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
		}
	    }
	    if (!rn2(7)) {
		if (destroy_mitem(mdef, SPBOOK_CLASS, AD_FIRE, dmgptr)) {
		    if (realizes_damage)
			oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
		}
	    }
	    if (youdefend && Slimed) {
		burn_away_slime();
		oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
	    }
	}

	if (attacks(AD_COLD, otmp, olaunch, thrown)) {
	    if (realizes_damage && (otmp->oartifact || spec_applies_ad_cold)) {
		if (otmp->oartifact == ART_FROST_BRAND)
		    wepdesc = "The ice-cold blade";
		pline("%s %s %s%c",
			wepdesc,
			!spec_applies_ad_cold ? "hits" : "freezes",
			hittee, !spec_applies_ad_cold ? '.' : '!');
		msg_printed = TRUE;
		if (spec_applies_ad_cold)
		    oprop_id(ITEM_FROST, otmp, ostack, olaunch);
	    }
	    if (!rn2(4)) {
		if (destroy_mitem(mdef, POTION_CLASS, AD_COLD, dmgptr)) {
		    if (realizes_damage)
			oprop_id(ITEM_FROST, otmp, ostack, olaunch);
		}
	    }
	}

	if (attacks(AD_ELEC, otmp, olaunch, thrown)) {
	    if (realizes_damage && (otmp->oartifact || spec_applies_ad_elec)) {
		pline("The massive hammer hits%s %s%c",
			  !spec_applies_ad_elec ? "" : "!  Lightning strikes",
			  hittee, !spec_applies_ad_elec ? '.' : '!');
		msg_printed = TRUE;
	    }
	    if (!rn2(5)) destroy_mitem(mdef, WAND_CLASS, AD_ELEC, dmgptr);
	}

	if (attacks(AD_MAGM, otmp, olaunch, thrown)) {
	    if (realizes_damage && (otmp->oartifact || spec_applies_ad_magm)) {
		pline("The imaginary widget hits%s %s%c",
			  !spec_applies_ad_magm ? "" :
				"!  A hail of magic missiles strikes",
			  hittee, !spec_applies_ad_magm ? '.' : '!');
		msg_printed = TRUE;
	    }
	}

	if (attacks(AD_STUN, otmp, olaunch, thrown) && dieroll <= MB_MAX_DIEROLL) {
	    /* Magicbane's special attacks (possibly modifies hittee[]) */
	    msg_printed = magicbane_hit(magr, mdef, otmp, dmgptr, dieroll, vis,
					hittee) || msg_printed;
	}

	if (otmp->oartifact != ART_THIEFBANE || !youdefend) {
	    if (!spec_dbon_applies &&
		!spec_applies_ad_drli && !spec_applies_spfx_behead) {
		/* since damage bonus didn't apply, nothing more to do;
		   no further attacks have side-effects on inventory */
		return msg_printed;
	    }
	}

	/* Stormbringer or thirsty weapon */
	if (spec_applies_ad_drli &&
	    (spec_ability(otmp, SPFX_DRLI) ||
	     oprop_attack(ITEM_DRLI, otmp, olaunch, thrown))) {
	    msg_printed = artifact_hit_drainlife(magr, mdef, otmp, ostack, olaunch,
						 dmgptr) || msg_printed;
	}

	/* Thiefbane, Tsurugi of Muramasa, Vorpal Blade or vorpal weapon */
	if (spec_applies_spfx_behead &&
	    (spec_ability(otmp, SPFX_BEHEAD) ||
	     oprop_attack(ITEM_VORPAL, otmp, olaunch, thrown))) {
	    boolean beheaded;
	    msg_printed = artifact_hit_behead(magr, mdef, otmp, ostack, olaunch,
					      dmgptr, dieroll, msg_printed,
					      &beheaded) || msg_printed;
	    /* No further effects if the monster was instakilled. */
	    if (beheaded)
		return msg_printed;
	}

	/* WAC -- 1/6 chance of cancellation with foobane weapons */
	if (otmp->oartifact == ART_ORCRIST ||
	    otmp->oartifact == ART_DRAGONBANE ||
	    otmp->oartifact == ART_DEMONBANE ||
	    otmp->oartifact == ART_WEREBANE ||
	    otmp->oartifact == ART_TROLLSBANE ||
	    otmp->oartifact == ART_THIEFBANE ||
	    otmp->oartifact == ART_OGRESMASHER) {
		if (!mdef->mcan && dieroll < 4) {
		    if (realizes_damage) {
			pline("%s %s as it strikes %s!",
			      The(distant_name(otmp, xname)),
			      Blind ? "roars deafeningly" : "shines brilliantly",
			      hittee);
		    }
		    cancel_monst(mdef, otmp, youattack, TRUE, magr == mdef);
		    msg_printed = TRUE;
		}
	}

	return msg_printed;
}